

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O0

void anon_unknown.dwarf_15ef52::EAXReverb_getParamfv(EffectProps *props,ALenum param,float *vals)

{
  undefined4 *in_RDX;
  int in_ESI;
  long in_RDI;
  EffectProps *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == 0xb) {
    *in_RDX = *(undefined4 *)(in_RDI + 0x3c);
    in_RDX[1] = *(undefined4 *)(in_RDI + 0x40);
    in_RDX[2] = *(undefined4 *)(in_RDI + 0x44);
  }
  else if (in_ESI == 0xe) {
    *in_RDX = *(undefined4 *)(in_RDI + 0x48);
    in_RDX[1] = *(undefined4 *)(in_RDI + 0x4c);
    in_RDX[2] = *(undefined4 *)(in_RDI + 0x50);
  }
  else {
    EAXReverb_getParamf(unaff_retaddr,(ALenum)((ulong)in_RDI >> 0x20),
                        (float *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void EAXReverb_getParamfv(const EffectProps *props, ALenum param, float *vals)
{
    switch(param)
    {
    case AL_EAXREVERB_REFLECTIONS_PAN:
        vals[0] = props->Reverb.ReflectionsPan[0];
        vals[1] = props->Reverb.ReflectionsPan[1];
        vals[2] = props->Reverb.ReflectionsPan[2];
        break;
    case AL_EAXREVERB_LATE_REVERB_PAN:
        vals[0] = props->Reverb.LateReverbPan[0];
        vals[1] = props->Reverb.LateReverbPan[1];
        vals[2] = props->Reverb.LateReverbPan[2];
        break;

    default:
        EAXReverb_getParamf(props, param, vals);
        break;
    }
}